

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O0

void __thiscall
libtorrent::torrent_handle::set_ssl_certificate_buffer
          (torrent_handle *this,string *certificate,string *private_key,string *dh_params)

{
  string *dh_params_local;
  string *private_key_local;
  string *certificate_local;
  torrent_handle *this_local;
  
  async_call<void(libtorrent::aux::torrent::*)(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
            (this,0x687670,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0,
             certificate,private_key);
  return;
}

Assistant:

void torrent_handle::set_ssl_certificate_buffer(
		std::string const& certificate
		, std::string const& private_key
		, std::string const& dh_params)
	{
#ifdef TORRENT_SSL_PEERS
		async_call(&aux::torrent::set_ssl_cert_buffer, certificate, private_key, dh_params);
#else
		TORRENT_UNUSED(certificate);
		TORRENT_UNUSED(private_key);
		TORRENT_UNUSED(dh_params);
#endif
	}